

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.cc
# Opt level: O1

int OBJ_find_sigid_by_algs(int *psignid,int dig_nid,int pkey_nid)

{
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = true;
  piVar1 = &kTriples[0].pkey_nid;
  uVar2 = 0;
  while ((piVar1[-1] != dig_nid || (*piVar1 != pkey_nid))) {
    bVar3 = uVar2 < 0x11;
    uVar2 = uVar2 + 1;
    piVar1 = piVar1 + 3;
    if (uVar2 == 0x12) {
LAB_004961fb:
      return (uint)bVar3;
    }
  }
  if (psignid != (int *)0x0) {
    *psignid = ((nid_triple *)(piVar1 + -2))->sign_nid;
  }
  goto LAB_004961fb;
}

Assistant:

int OBJ_find_sigid_by_algs(int *out_sign_nid, int digest_nid, int pkey_nid) {
  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kTriples); i++) {
    if (kTriples[i].digest_nid == digest_nid &&
        kTriples[i].pkey_nid == pkey_nid) {
      if (out_sign_nid != NULL) {
        *out_sign_nid = kTriples[i].sign_nid;
      }
      return 1;
    }
  }

  return 0;
}